

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

AST_Compound_Statement * get_compound_statement_tree(Scope *parent_scope)

{
  AST_Compound_Statement *pAVar1;
  Scope *pSVar2;
  
  pAVar1 = (AST_Compound_Statement *)malloc(0x28);
  pAVar1->type = ST_COMPOUND;
  Queue_Init(&pAVar1->components);
  pSVar2 = get_normal_scope(parent_scope,BLOCK_SCOPE);
  pAVar1->scope = pSVar2;
  return pAVar1;
}

Assistant:

struct AST_Compound_Statement* get_compound_statement_tree(struct Scope *parent_scope)
{
	struct AST_Compound_Statement *ret;
	ret=malloc(sizeof(struct AST_Compound_Statement));
	ret->type=ST_COMPOUND;
	Queue_Init(&ret->components);
	ret->scope=get_normal_scope(parent_scope,BLOCK_SCOPE);
	return ret;
}